

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O1

void __thiscall time2::operator()(time2 *this,error_code *e)

{
  ostream *poVar1;
  runtime_error *this_00;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if (*(int *)e == 1) {
    occured2_at._0_12_ = booster::ptime::now();
    booster::aio::io_service::stop();
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/aio/test/test_timer.cpp"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," e.value()==booster::aio::aio_error::canceled",0x2d);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1b0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		TEST(e.value()==booster::aio::aio_error::canceled);
		occured2_at = booster::ptime::now();
		srv->stop();

	}